

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O0

string * AppendPID(string *__return_storage_ptr__,string *str)

{
  __pid_t __val;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *str_local;
  
  local_18 = str;
  str_local = __return_storage_ptr__;
  std::operator+(&local_38,str,"_");
  __val = getpid();
  std::__cxx11::to_string(&local_58,__val);
  std::operator+(__return_storage_ptr__,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendPID(const std::string &str) {
  return str + "_" + std::to_string(getpid());
}